

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_hash_context_t * ptls_hmac_create(ptls_hash_algorithm_t *algo,void *key,size_t key_size)

{
  st_picotls_hmac_context_t *ctx_00;
  ptls_hash_context_t *ppVar1;
  ulong in_RDX;
  void *in_RSI;
  ulong *in_RDI;
  st_picotls_hmac_context_t *ctx;
  uint8_t in_stack_ffffffffffffff9f;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  ulong *local_40;
  undefined8 local_38;
  undefined1 auStack_30 [8];
  st_picotls_hmac_context_t *local_28;
  ulong local_20;
  void *local_18;
  ulong *local_10;
  st_picotls_hmac_context_t *local_8;
  
  if (in_RDX <= *in_RDI) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    ctx_00 = (st_picotls_hmac_context_t *)malloc(*in_RDI + 0x28);
    if (ctx_00 == (st_picotls_hmac_context_t *)0x0) {
      local_8 = (st_picotls_hmac_context_t *)0x0;
    }
    else {
      local_58 = hmac_update;
      local_50 = hmac_final;
      local_48 = 0;
      local_40 = local_10;
      local_38 = 0;
      local_28 = ctx_00;
      memset(auStack_30,0,1);
      memcpy(ctx_00,&local_58,0x30);
      ppVar1 = (ptls_hash_context_t *)(*(code *)local_10[2])();
      local_28->hash = ppVar1;
      if (ppVar1 == (ptls_hash_context_t *)0x0) {
        free(local_28);
        local_8 = (st_picotls_hmac_context_t *)0x0;
      }
      else {
        memset(local_28->key,0,*local_10);
        memcpy(local_28->key,local_18,local_20);
        hmac_apply_key(ctx_00,in_stack_ffffffffffffff9f);
        local_8 = local_28;
      }
    }
    return &local_8->super;
  }
  __assert_fail("key_size <= algo->block_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x13ea,
                "ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *, const void *, size_t)"
               );
}

Assistant:

ptls_hash_context_t *ptls_hmac_create(ptls_hash_algorithm_t *algo, const void *key, size_t key_size)
{
    struct st_picotls_hmac_context_t *ctx;

    assert(key_size <= algo->block_size);

    if ((ctx = malloc(offsetof(struct st_picotls_hmac_context_t, key) + algo->block_size)) == NULL)
        return NULL;

    *ctx = (struct st_picotls_hmac_context_t){{hmac_update, hmac_final}, algo};
    if ((ctx->hash = algo->create()) == NULL) {
        free(ctx);
        return NULL;
    }
    memset(ctx->key, 0, algo->block_size);
    memcpy(ctx->key, key, key_size);

    hmac_apply_key(ctx, 0x36);

    return &ctx->super;
}